

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O0

void __thiscall
NetworkNS::cb3D_integrator::cb3D_integrator
          (cb3D_integrator *this,NetwMin *init_net,double temperature,double slipspring_rate)

{
  bool bVar1;
  size_type sVar2;
  double *pdVar3;
  int *piVar4;
  double **ppdVar5;
  reference psVar6;
  ostream *poVar7;
  Hopping *this_00;
  double dVar8;
  double local_60;
  double prev_val;
  _Self local_50;
  iterator it;
  double monomeric_friction;
  uint inode;
  double gamma;
  uint i;
  double slipspring_rate_local;
  double temperature_local;
  NetwMin *init_net_local;
  cb3D_integrator *this_local;
  
  this->cur_bd_net = init_net;
  this->bd_cur_step = 0;
  sVar2 = std::__cxx11::list<sNode,_std::allocator<sNode>_>::size(&this->cur_bd_net->network->nodes)
  ;
  this->dofs = (uint)sVar2;
  this->dofs_3N = this->dofs * 3;
  pdVar3 = (double *)malloc((ulong)this->dofs << 3);
  this->xshift = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs << 3);
  this->yshift = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs << 3);
  this->zshift = pdVar3;
  piVar4 = (int *)malloc((ulong)this->dofs << 2);
  this->grid_cell = piVar4;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_x = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_x_ps = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_mass = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_f = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_f_ps = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_nb_f = pdVar3;
  pdVar3 = (double *)malloc((ulong)this->dofs_3N << 3);
  this->bd_gamma = pdVar3;
  ppdVar5 = (double **)malloc((ulong)this->dofs << 3);
  this->bd_stress = ppdVar5;
  for (gamma._4_4_ = 0; gamma._4_4_ < this->dofs; gamma._4_4_ = gamma._4_4_ + 1) {
    pdVar3 = (double *)malloc(0x30);
    this->bd_stress[gamma._4_4_] = pdVar3;
  }
  this->bd_temp = temperature;
  monomeric_friction._4_4_ = 0;
  dVar8 = pow(10.0,607.5 / ((this->bd_temp - 211.15) + 45.0) - 10.4);
  it._M_node = (_List_node_base *)(dVar8 * 0.001);
  dVar8 = (double)it._M_node / 1.1311591129852e-25;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<sNode,_std::allocator<sNode>_>::begin(&this->cur_bd_net->network->nodes);
  while( true ) {
    prev_val = (double)std::__cxx11::list<sNode,_std::allocator<sNode>_>::end
                                 (&this->cur_bd_net->network->nodes);
    bVar1 = std::operator!=(&local_50,(_Self *)&prev_val);
    if (!bVar1) break;
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x[monomeric_friction._4_4_ * 3] = psVar6->Pos[0];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x[monomeric_friction._4_4_ * 3 + 1] = psVar6->Pos[1];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x[monomeric_friction._4_4_ * 3 + 2] = psVar6->Pos[2];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x_ps[monomeric_friction._4_4_ * 3] = psVar6->Pos[0];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x_ps[monomeric_friction._4_4_ * 3 + 1] = psVar6->Pos[1];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_x_ps[monomeric_friction._4_4_ * 3 + 2] = psVar6->Pos[2];
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_mass[monomeric_friction._4_4_ * 3] = psVar6->mass;
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_mass[monomeric_friction._4_4_ * 3 + 1] = psVar6->mass;
    psVar6 = std::_List_iterator<sNode>::operator*(&local_50);
    this->bd_mass[monomeric_friction._4_4_ * 3 + 2] = psVar6->mass;
    this->bd_gamma[monomeric_friction._4_4_ * 3] = dVar8;
    this->bd_gamma[monomeric_friction._4_4_ * 3 + 1] = dVar8;
    this->bd_gamma[monomeric_friction._4_4_ * 3 + 2] = dVar8;
    monomeric_friction._4_4_ = monomeric_friction._4_4_ + 1;
    std::_List_iterator<sNode>::operator++(&local_50);
  }
  local_60 = *this->bd_mass * *this->bd_gamma;
  this->gamma_mass_opt = true;
  monomeric_friction._4_4_ = 1;
  do {
    if (this->dofs_3N <= monomeric_friction._4_4_) {
LAB_0010481a:
      if ((this->gamma_mass_opt & 1U) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n"
                                );
        poVar7 = std::operator<<(poVar7,
                                 "#: --- All beads have the same mass and friction coefficient.\n");
        poVar7 = std::operator<<(poVar7,"#: --- The monomeric friction coefficient is ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)it._M_node);
        poVar7 = std::operator<<(poVar7," kg/s.\n");
        poVar7 = std::operator<<(poVar7,"#: --- The friction coefficient is ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*this->bd_gamma);
        poVar7 = std::operator<<(poVar7," s^{-1}.\n");
        poVar7 = std::operator<<(poVar7,"#: --- The bead friction coefficient is ");
        poVar7 = (ostream *)
                 std::ostream::operator<<(poVar7,*this->bd_mass * *this->bd_gamma * 1.660538921e-27)
        ;
        poVar7 = std::operator<<(poVar7," kg/s.\n");
        poVar7 = std::operator<<(poVar7,
                                 "#: --- The expected Rouse diffusivity multiplied by N would be: ")
        ;
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,(((this->bd_temp * 1.3806488e-23) / *this->bd_mass) /
                                   *this->bd_gamma) / 1.660538921e-27);
        poVar7 = std::operator<<(poVar7," m^2/s.\n#:");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      sVar2 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size
                        (&this->cur_bd_net->network->pslip_springs);
      if (sVar2 != 0) {
        this_00 = (Hopping *)operator_new(0x408);
        Hopping::Hopping(this_00,slipspring_rate);
        this->my_hopping_scheme = this_00;
      }
      return;
    }
    if (0.0001 <= (this->bd_mass[monomeric_friction._4_4_] *
                   this->bd_gamma[monomeric_friction._4_4_] + -local_60) *
                  (this->bd_mass[monomeric_friction._4_4_] *
                   this->bd_gamma[monomeric_friction._4_4_] + -local_60)) {
      this->gamma_mass_opt = false;
      goto LAB_0010481a;
    }
    local_60 = this->bd_mass[monomeric_friction._4_4_] * this->bd_gamma[monomeric_friction._4_4_];
    monomeric_friction._4_4_ = monomeric_friction._4_4_ + 1;
  } while( true );
}

Assistant:

cb3D_integrator::cb3D_integrator(class NetwMin *init_net, double temperature, double slipspring_rate) {
      
      
      cur_bd_net = init_net;
      bd_cur_step = 0;
      dofs = cur_bd_net->network->nodes.size();
      dofs_3N = 3 * dofs;
      
      xshift = (double*)malloc(dofs*sizeof(double));
      yshift = (double*)malloc(dofs*sizeof(double));
      zshift = (double*)malloc(dofs*sizeof(double));
      grid_cell = (int*)malloc(dofs*sizeof(int));

      bd_x = (double*) malloc(dofs_3N * sizeof (double));
      bd_x_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_mass = (double*) malloc(dofs_3N * sizeof (double));
      bd_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_f_ps = (double*) malloc(dofs_3N * sizeof (double));
      bd_nb_f = (double*) malloc(dofs_3N * sizeof (double));
      bd_gamma = (double*) malloc(dofs_3N * sizeof (double));
      
      
      bd_stress = (double**)malloc(dofs * sizeof(double*));
      for(unsigned int i = 0; i < dofs; i++)
         bd_stress[i] = (double*)malloc(6*sizeof(double));
      
      
      // Set the temperature:
      bd_temp = temperature;

      double gamma;
      unsigned int inode = 0;


      /** Klopffer et al. (\a Polymer \b 1998, \a 39, 3445 - 3449) have characterized the 
       *  rheological behavior of a series of polybutadienes and polyisoprenes over a wide
       *  range of temperatures. The viscoelastic coefficients resulting from the time-
       *  temperature superposition principle were determined. The Rouse theory modified for 
       *  undiluted polymers was used to calculate the monomeric friction coefficient, 
       *  @f$ \zeta_0@f$ from the transition zone.
       *  It was concluded that, within experimental error, a single set of WLF parameters at
       *  @f$ T_{\rm g}@f$ was adequate to characterize the relaxation dynamics irrespective of
       *  the vinyl content of the polybutadienes and polyisoprenes. 
       */

      /** The monomeric friction coefficient, @f$\zeta_0 @f$, characterizes the resistance 
       * encountered by a monomer unit moving through its surroundings. It has been shown to follow 
       * the WLF law. The variation of the monomeric friction coefficient with temperature is: 
       * @f[ \log{\zeta_0 \left(T\right)} = \log{\zeta_\infty} + \frac{C_1^{\rm g}C_2^{\rm g}}
       *    {T-T_{\rm g} + C_2^{\rm g}} @f]
       * with the parameters @f$ C_1^{\rm g} = 13.5 \pm 0.2 @f$, 
       * @f$ C_2^{\rm g} = 45 \pm 3 \;{\rm K}@f$, 
       * @f$ \log{\zeta_\infty} = -10.4 \;{\rm dyn\;s\;cm}^{-1}@f$ 
       * and @f$ T_{\rm g} = 211.15 \;{\rm K} @f$. 
       * At a temperature of 298 K, 
       * @f$\zeta_0(298\:{\rm K}) = 1.61 \times 10^{-6} \;{\rm dyn\;s\;cm}^{-1}@f$, while
       * at a temperature of  500 K,
       * @f$\zeta_0(500\:{\rm K}) = 2.63 \times 10^{-9} \;{\rm dyn\;s\;cm}^{-1}
       * = 2.63 \times 10^{-12} \;{\rm kg/s}@f$.
       */

      // Monomeric friction coefficient in  kg/s
      double monomeric_friction = 1.e-3 * pow(10.0, ((13.5 * 45.0)/(bd_temp-211.15+45)-10.4)); 
      
      /** The @f$\zeta @f$ parameter refers to a monomer of PI moving through its environment. 
       *  Since, we are dealing with larger entities, we analyze it as:
       * @f[ \zeta_0 \left(T\right) = \gamma\left(T\right) \cdot m_{\rm monomer} @f]
       * where @f$ \gamma (T)@f$ is measured in @f$ {\rm s}^{-1} @f$ and can be then multiplied by 
       * the mass of the Brownian bead which consists of several PI monomers.
       */

      // convert monomeric friction coefficient (kg/s) to g/mol/s and then divide it with the mass 
      // of a PI monomer 
      gamma = monomeric_friction / (pi_monomer_mass * amu_to_kg); // s^{-1}

      for (std::list<tNode>::iterator it = cur_bd_net->network->nodes.begin();
              it != cur_bd_net->network->nodes.end(); ++it) {

         // positions in A
         bd_x[3 * inode + 0] = (*it).Pos[0];
         bd_x[3 * inode + 1] = (*it).Pos[1];
         bd_x[3 * inode + 2] = (*it).Pos[2];

         // positions in A
         bd_x_ps[3 * inode + 0] = (*it).Pos[0];
         bd_x_ps[3 * inode + 1] = (*it).Pos[1];
         bd_x_ps[3 * inode + 2] = (*it).Pos[2];

         // mass of nodal points in g/mol
         bd_mass[3 * inode + 0] = (*it).mass;
         bd_mass[3 * inode + 1] = (*it).mass;
         bd_mass[3 * inode + 2] = (*it).mass;

         // All gamma are measured in s^{-1}
         bd_gamma[3 * inode + 0] = gamma;
         bd_gamma[3 * inode + 1] = gamma;
         bd_gamma[3 * inode + 2] = gamma;

         inode++;
      }

      
      /* Check whether all beads have the same mass and the same friction coefficient. */
      double prev_val = bd_mass[0] * bd_gamma[0];
      gamma_mass_opt = true;
      for (inode = 1; inode < dofs_3N; inode++){
         if ( ((bd_mass[inode]*bd_gamma[inode])-prev_val)
             *((bd_mass[inode]*bd_gamma[inode])-prev_val) >= tol){
            gamma_mass_opt = false;
            break;
         }
         else
            prev_val = bd_mass[inode]*bd_gamma[inode];
      }
      
      if (gamma_mass_opt) 
         cout << "#:\n#: Brownian Dynamics integrator will run in the optimized way.\n"
              << "#: --- All beads have the same mass and friction coefficient.\n" 
              << "#: --- The monomeric friction coefficient is " << monomeric_friction << " kg/s.\n"
              << "#: --- The friction coefficient is " << bd_gamma[0] << " s^{-1}.\n" 
              << "#: --- The bead friction coefficient is " << bd_mass[0]*bd_gamma[0]*amu_to_kg 
              << " kg/s.\n" 
              << "#: --- The expected Rouse diffusivity multiplied by N would be: " 
              << boltz_const_Joule_K * bd_temp / bd_mass[0] / bd_gamma[0] / amu_to_kg 
              << " m^2/s.\n#:"<< endl;
      
      // Initialize the coupled hopping scheme:
      // Here we can input the zeta parameter...
      if (cur_bd_net->network->pslip_springs.size() > 0)
         my_hopping_scheme = new Hopping(slipspring_rate);
            
      return;
   }